

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

uint __thiscall kj::_::BTreeImpl::Parent::keyCount(Parent *this)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = this->keys[3].i != 0;
  uVar1 = (uint)bVar2 * 4 + (uint)(this->keys[(ulong)bVar2 * 4 + 1].i != 0) * 2;
  return this->keys[uVar1].i != 0 | uVar1;
}

Assistant:

inline bool operator!=(decltype(nullptr)) const { return i != 0; }